

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O3

void __thiscall llvm::APFloat::APFloat(APFloat *this,fltSemantics *Semantics,StringRef S)

{
  if (Semantics == (fltSemantics *)semPPCDoubleDouble) {
    detail::DoubleAPFloat::DoubleAPFloat
              ((DoubleAPFloat *)&(this->U).IEEE,(fltSemantics *)semPPCDoubleDouble);
  }
  else {
    detail::IEEEFloat::IEEEFloat(&(this->U).IEEE,Semantics);
  }
  convertFromString(this,S,rmNearestTiesToEven);
  return;
}

Assistant:

APFloat::APFloat(const fltSemantics &Semantics, StringRef S)
    : APFloat(Semantics) {
  convertFromString(S, rmNearestTiesToEven);
}